

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

int __thiscall HPresolve::getSingColElementIndexInA(HPresolve *this,int j)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  
  uVar11 = (ulong)j;
  piVar2 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  uVar13 = uVar11;
  if (uVar11 < uVar8) {
    uVar5 = (ulong)piVar2[uVar11];
    piVar2 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    uVar8 = uVar9;
    uVar13 = uVar5;
    if (uVar5 < uVar9) {
      piVar3 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
      do {
        uVar13 = (ulong)piVar2[uVar5];
        uVar8 = uVar7;
        if (uVar7 <= uVar13) break;
        if (piVar3[uVar13] != 0) {
          piVar4 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar8 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
          uVar13 = uVar11;
          if (uVar11 < uVar8) {
            iVar1 = piVar4[uVar11];
            uVar11 = uVar5;
            if ((int)uVar5 < iVar1) goto LAB_0013ff54;
            pcVar12 = "Error during presolve: no variable found in singleton col ";
            lVar10 = 0x3a;
            goto LAB_0013ffa6;
          }
          break;
        }
        uVar5 = uVar5 + 1;
        uVar8 = uVar9;
        uVar13 = uVar5;
      } while (uVar5 < uVar9);
    }
  }
LAB_0013ffe1:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar8);
LAB_0013ff54:
  do {
    uVar11 = uVar11 + 1;
    if ((long)iVar1 <= (long)uVar11) goto LAB_0013ffd2;
    uVar8 = uVar9;
    uVar13 = uVar11;
    if ((uVar9 <= uVar11) || (uVar13 = (ulong)piVar2[uVar11], uVar8 = uVar7, uVar7 <= uVar13))
    goto LAB_0013ffe1;
  } while (piVar3[uVar13] == 0);
  if ((long)uVar11 < (long)iVar1) {
    pcVar12 = "Error during presolve: more variables found in singleton col ";
    lVar10 = 0x3d;
LAB_0013ffa6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar10);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,j);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    uVar5 = 0xffffffff;
  }
LAB_0013ffd2:
  return (int)uVar5;
}

Assistant:

int HPresolve::getSingColElementIndexInA(int j) {
	int k=Astart.at(j);
    while (!flagRow.at(Aindex.at(k)))
           ++k ;
    if (k >= Aend.at(j)) {
		cout<<"Error during presolve: no variable found in singleton col "<<j<<".";
		return -1;
	}
    int rest = k+1;
	while (rest < Aend.at(j) && !flagRow.at(Aindex.at(rest)))
		++rest ;
	if (rest < Aend.at(j)) {
		cout<<"Error during presolve: more variables found in singleton col "<<j<<".";
		return -1;
	}
    return k;
}